

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fifo_path_posix.cpp
# Opt level: O1

pipe_descriptor __thiscall
anon_unknown.dwarf_1b2b50::open_fifo(anon_unknown_dwarf_1b2b50 *this,czstring path,int flags)

{
  errno_erc eVar1;
  int iVar2;
  int *piVar3;
  basic_ostream<char,_std::char_traits<char>_> *pbVar4;
  ostringstream str;
  stat buf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  ostringstream local_228 [376];
  stat local_b0;
  
  iVar2 = open(path,flags | 0x800);
  *(int *)this = iVar2;
  if (-1 < iVar2) {
    memset(&local_b0,0,0x90);
    iVar2 = fstat(iVar2,&local_b0);
    local_248._M_dataplus._M_p = path;
    if (iVar2 != 0) {
      piVar3 = __errno_location();
      eVar1.err_ = *piVar3;
      std::__cxx11::ostringstream::ostringstream(local_228);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_228,"Could not stat the file at ",0x1b);
      local_248._M_string_length._0_2_ = 0x22;
      std::__detail::operator<<
                ((basic_ostream<char,_std::char_traits<char>_> *)local_228,
                 (_Quoted_string<const_char_*,_char> *)&local_248);
      std::__cxx11::stringbuf::str();
      pstore::raise<pstore::errno_erc,std::__cxx11::string>(eVar1,&local_248);
    }
    if ((local_b0.st_mode & 0xf000) != 0x1000) {
      piVar3 = __errno_location();
      eVar1.err_ = *piVar3;
      std::__cxx11::ostringstream::ostringstream(local_228);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,"The file at ",0xc);
      local_248._M_string_length._0_2_ = 0x22;
      pbVar4 = std::__detail::operator<<
                         ((basic_ostream<char,_std::char_traits<char>_> *)local_228,
                          (_Quoted_string<const_char_*,_char> *)&local_248);
      std::__ostream_insert<char,std::char_traits<char>>(pbVar4," was not a FIFO",0xf);
      std::__cxx11::stringbuf::str();
      pstore::raise<pstore::errno_erc,std::__cxx11::string>(eVar1,&local_248);
    }
  }
  return (pipe_descriptor)this;
}

Assistant:

pstore::pipe_descriptor open_fifo (pstore::gsl::czstring const path, int const flags) {
        pstore::pipe_descriptor pipe{::open (path, flags | O_NONBLOCK)};
        if (pipe.native_handle () < 0) {
            return pipe;
        }
        // If the file open succeeded. We check whether it's a FIFO.
        struct stat buf {};
        if (::fstat (pipe.native_handle (), &buf) != 0) {
            int const errcode = errno;
            std::ostringstream str;
            str << "Could not stat the file at " << pstore::quoted (path);
            raise (pstore::errno_erc{errcode}, str.str ());
        }
        if (!S_ISFIFO (buf.st_mode)) { //! OCLINT
            int const errcode = errno;
            std::ostringstream str;
            str << "The file at " << pstore::quoted (path) << " was not a FIFO";
            raise (pstore::errno_erc{errcode}, str.str ());
        }
        return pipe;
    }